

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall t_perl_generator::generate_enum(t_perl_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  _Alloc_hider _Var4;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_50;
  
  poVar1 = &this->f_types_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"package ",8);
  perl_namespace_abi_cxx11_(&local_50,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_50,&tenum->constants_
            );
  _Var4._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_dataplus._M_p != (pointer)local_50._M_string_length) {
    do {
      iVar2 = *(int *)(*(long *)_Var4._M_p + 0x80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"use constant ",0xd);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,*(char **)(*(long *)_Var4._M_p + 0x60),
                          *(long *)(*(long *)_Var4._M_p + 0x68));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var4._M_p = _Var4._M_p + 8;
    } while (_Var4._M_p != (pointer)local_50._M_string_length);
  }
  if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_perl_generator::generate_enum(t_enum* tenum) {
  f_types_ << "package " << perl_namespace(program_) << tenum->get_name() << ";" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    f_types_ << "use constant " << (*c_iter)->get_name() << " => " << value << ";" << endl;
  }
}